

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

void COutPoint::
     SerializationOps<ParamsStream<AutoFile&,TransactionSerParams>,COutPoint_const,ActionSerialize>
               (ParamsStream<AutoFile_&,_TransactionSerParams> *param_1,
               transaction_identifier<false> *param_2)

{
  long lVar1;
  long in_FS_OFFSET;
  uint *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ActionSerialize::
  SerReadWriteMany<ParamsStream<AutoFile&,TransactionSerParams>,transaction_identifier<false>,unsigned_int>
            (param_1,param_2,in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(COutPoint, obj) { READWRITE(obj.hash, obj.n); }